

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDEdgeSharpness::IsValid(ON_SubDEdgeSharpness *this)

{
  if (((0.0 <= this->m_edge_sharpness[0]) && (this->m_edge_sharpness[0] <= 4.0)) &&
     (0.0 <= this->m_edge_sharpness[1])) {
    return this->m_edge_sharpness[1] <= 4.0;
  }
  return false;
}

Assistant:

bool ON_SubDEdgeSharpness::IsValid() const
{
  // NOTE WELL:
  // ON_SubDEdgeSharpness::Crease::IsValid() and ON_SubDEdgeSharpness::Nan::IsValid()
  // must be false.
  return
    m_edge_sharpness[0] >= 0.0f
    && m_edge_sharpness[0] <= ((float)ON_SubDEdgeSharpness::MaximumValue)
    && m_edge_sharpness[1] >= 0.0f
    && m_edge_sharpness[1] <= ((float)ON_SubDEdgeSharpness::MaximumValue)
    ;
}